

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayfork.c
# Opt level: O3

rf_ray_hit_info * rf_collision_ray_model(rf_ray ray,rf_model model)

{
  float fVar1;
  float fVar2;
  float fVar3;
  undefined8 uVar4;
  int iVar5;
  long lVar6;
  long lVar7;
  rf_ray ray_00;
  int *piVar8;
  ulong uVar9;
  float *pfVar10;
  long lVar11;
  float *pfVar12;
  ulong uVar13;
  float *pfVar14;
  float *pfVar15;
  rf_ray_hit_info *in_RDI;
  float *pfVar16;
  ulong uVar17;
  long lVar18;
  rf_vec3 *vertdata;
  float fVar19;
  float fVar20;
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  rf_vec3 p1;
  rf_vec3 p2;
  rf_vec3 p3;
  undefined8 in_stack_00000008;
  undefined8 in_stack_00000010;
  undefined8 in_stack_00000018;
  float in_stack_00000020;
  float in_stack_00000024;
  float in_stack_00000028;
  float in_stack_0000002c;
  float in_stack_00000030;
  float in_stack_00000034;
  float in_stack_00000038;
  float in_stack_0000003c;
  rf_ray_hit_info tri_hit_info;
  long in_stack_00000060;
  long in_stack_00000068;
  rf_ray_hit_info local_98;
  float local_78;
  float fStack_74;
  float local_68;
  float fStack_64;
  float local_58;
  float fStack_54;
  float local_48;
  float fStack_44;
  
  *(undefined8 *)&(in_RDI->position).z = 0;
  (in_RDI->normal).y = 0.0;
  (in_RDI->normal).z = 0.0;
  in_RDI->hit = false;
  *(undefined3 *)&in_RDI->field_0x1 = 0;
  in_RDI->distance = 0.0;
  (in_RDI->position).x = 0.0;
  (in_RDI->position).y = 0.0;
  if (0 < in_stack_00000060) {
    local_48 = in_stack_0000002c;
    fStack_44 = in_stack_0000003c;
    local_58 = in_stack_00000028;
    fStack_54 = in_stack_00000038;
    local_68 = in_stack_00000020;
    fStack_64 = in_stack_00000030;
    local_78 = in_stack_00000024;
    fStack_74 = in_stack_00000034;
    lVar11 = 0;
    do {
      lVar6 = *(long *)(in_stack_00000068 + 8 + lVar11 * 0x70);
      if (lVar6 != 0) {
        piVar8 = (int *)(lVar11 * 0x70 + in_stack_00000068);
        iVar5 = *piVar8;
        if (2 < iVar5) {
          lVar18 = (long)(iVar5 / 3);
          lVar7 = *(long *)(piVar8 + 0xe);
          pfVar15 = (float *)(lVar6 + 0x20);
          uVar17 = 0;
          do {
            if (lVar7 == 0) {
              pfVar10 = pfVar15 + -5;
              pfVar12 = pfVar15 + -3;
              pfVar14 = pfVar15 + -2;
              uVar9 = uVar17;
              pfVar16 = pfVar15;
            }
            else {
              uVar9 = (ulong)*(ushort *)(lVar7 + 2 + uVar17 * 2);
              pfVar10 = (float *)(lVar6 + uVar9 * 0xc);
              pfVar12 = (float *)(lVar6 + uVar9 * 0xc + 8);
              uVar13 = (ulong)*(ushort *)(lVar7 + 4 + uVar17 * 2);
              pfVar14 = (float *)(lVar6 + uVar13 * 0xc);
              uVar9 = (ulong)*(ushort *)(lVar7 + uVar17 * 2);
              pfVar16 = (float *)(lVar6 + uVar13 * 0xc + 8);
            }
            fVar1 = *(float *)(lVar6 + 8 + uVar9 * 0xc);
            uVar4 = *(undefined8 *)(lVar6 + uVar9 * 0xc);
            fVar19 = (float)uVar4;
            fVar20 = (float)((ulong)uVar4 >> 0x20);
            fVar2 = *pfVar12;
            fVar3 = *pfVar16;
            fVar23 = (float)*(undefined8 *)pfVar14;
            fVar24 = (float)((ulong)*(undefined8 *)pfVar14 >> 0x20);
            fVar21 = (float)*(undefined8 *)pfVar10;
            fVar22 = (float)((ulong)*(undefined8 *)pfVar10 >> 0x20);
            p1.x = fVar1 * local_58 + fVar19 * local_68 + fVar20 * local_78 + local_48;
            p1.y = fVar1 * fStack_54 + fVar19 * fStack_64 + fVar20 * fStack_74 + fStack_44;
            p1.z = fVar20 * tri_hit_info.distance + (float)tri_hit_info._0_4_ * fVar19 +
                   tri_hit_info.position.x * fVar1 + tri_hit_info.position.y;
            p2.x = fVar2 * local_58 + fVar21 * local_68 + fVar22 * local_78 + local_48;
            p2.y = fVar2 * fStack_54 + fVar21 * fStack_64 + fVar22 * fStack_74 + fStack_44;
            p2.z = fVar22 * tri_hit_info.distance + (float)tri_hit_info._0_4_ * fVar21 +
                   tri_hit_info.position.x * fVar2 + tri_hit_info.position.y;
            p3.x = fVar3 * local_58 + fVar23 * local_68 + fVar24 * local_78 + local_48;
            p3.y = fVar3 * fStack_54 + fVar23 * fStack_64 + fVar24 * fStack_74 + fStack_44;
            p3.z = fVar24 * tri_hit_info.distance + (float)tri_hit_info._0_4_ * fVar23 +
                   tri_hit_info.position.x * fVar3 + tri_hit_info.position.y;
            ray_00._8_8_ = in_stack_00000010;
            ray_00.position._0_8_ = in_stack_00000008;
            ray_00.direction._4_8_ = in_stack_00000018;
            rf_collision_ray_triangle(&local_98,ray_00,p1,p2,p3);
            if ((local_98.hit == true) &&
               ((in_RDI->hit != true || (local_98.distance < in_RDI->distance)))) {
              *(undefined8 *)&(in_RDI->position).z = local_98._16_8_;
              (in_RDI->normal).y = local_98.normal.y;
              (in_RDI->normal).z = local_98.normal.z;
              in_RDI->hit = (_Bool)local_98.hit;
              *(int3 *)&in_RDI->field_0x1 = local_98._1_3_;
              in_RDI->distance = local_98.distance;
              (in_RDI->position).x = local_98.position.x;
              (in_RDI->position).y = local_98.position.y;
            }
            uVar17 = uVar17 + 3;
            pfVar15 = pfVar15 + 9;
            lVar18 = lVar18 + -1;
          } while (lVar18 != 0);
        }
      }
      lVar11 = lVar11 + 1;
    } while (lVar11 != in_stack_00000060);
  }
  return in_RDI;
}

Assistant:

RF_API rf_ray_hit_info rf_collision_ray_model(rf_ray ray, rf_model model)
{
    rf_ray_hit_info result = {0};

    for (rf_int m = 0; m < model.mesh_count; m++)
    {
// Check if meshhas vertex data on CPU for testing
        if (model.meshes[m].vertices != NULL)
        {
// model->mesh.triangle_count may not be set, vertex_count is more reliable
            int triangle_count = model.meshes[m].vertex_count / 3;

// Test against all triangles in mesh
            for (rf_int i = 0; i < triangle_count; i++)
            {
                rf_vec3 a, b, c;
                rf_vec3 *vertdata = (rf_vec3 *) model.meshes[m].vertices;

                if (model.meshes[m].indices)
                {
                    a = vertdata[model.meshes[m].indices[i * 3 + 0]];
                    b = vertdata[model.meshes[m].indices[i * 3 + 1]];
                    c = vertdata[model.meshes[m].indices[i * 3 + 2]];
                } else
                {
                    a = vertdata[i * 3 + 0];
                    b = vertdata[i * 3 + 1];
                    c = vertdata[i * 3 + 2];
                }

                a = rf_vec3_transform(a, model.transform);
                b = rf_vec3_transform(b, model.transform);
                c = rf_vec3_transform(c, model.transform);

                rf_ray_hit_info tri_hit_info = rf_collision_ray_triangle(ray, a, b, c);

                if (tri_hit_info.hit)
                {
// Save the closest hit triangle
                    if ((!result.hit) || (result.distance > tri_hit_info.distance)) result = tri_hit_info;
                }
            }
        }
    }

    return result;
}